

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::SerializePartialToArray(MessageLite *this,void *data,int size)

{
  int size_00;
  undefined4 extraout_var;
  LogMessage *pLVar1;
  string_view v_00;
  LogMessage local_30;
  ulong v;
  
  size_00 = (*this->_vptr_MessageLite[3])();
  v = CONCAT44(extraout_var,size_00);
  if ((v & 0xffffffff80000000) == 0) {
    if ((long)v <= (long)size) {
      SerializeToArrayImpl(this,(uint8_t *)data,size_00);
      return true;
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x270);
    v_00 = GetTypeName(this);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_30,v_00);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [41])" exceeded maximum protobuf size of 2GB: ");
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,v);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_30);
  }
  return false;
}

Assistant:

bool MessageLite::SerializePartialToArray(void* data, int size) const {
  const size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    ABSL_LOG(ERROR) << GetTypeName()
                    << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }
  if (size < static_cast<int64_t>(byte_size)) return false;
  uint8_t* start = reinterpret_cast<uint8_t*>(data);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}